

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_enc.cc
# Opt level: O3

int der_cmp(void *a,void *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = *(int *)((long)a + 8);
  iVar2 = *(int *)((long)b + 8);
  iVar3 = iVar2;
  if (iVar1 < iVar2) {
    iVar3 = iVar1;
  }
  if ((iVar3 != 0) && (iVar3 = memcmp(*a,*b,(long)iVar3), iVar3 != 0)) {
    return iVar3;
  }
  return iVar1 - iVar2;
}

Assistant:

static int der_cmp(const void *a, const void *b) {
  const DER_ENC *d1 = reinterpret_cast<const DER_ENC *>(a),
                *d2 = reinterpret_cast<const DER_ENC *>(b);
  int cmplen, i;
  cmplen = (d1->length < d2->length) ? d1->length : d2->length;
  i = OPENSSL_memcmp(d1->data, d2->data, cmplen);
  if (i) {
    return i;
  }
  return d1->length - d2->length;
}